

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcOrderAction::~IfcOrderAction(IfcOrderAction *this)

{
  IfcTask *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&this->super_IfcTask + -0x18);
  this_00 = (IfcTask *)(&(this->super_IfcTask).field_0x0 + lVar2);
  pvVar1 = &this->field_0x1b0 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x1b0) = 0x9538d0;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x9539c0;
  *(undefined8 *)((long)pvVar1 + -0x128) = 0x9538f8;
  *(undefined8 *)((long)pvVar1 + -0x118) = 0x953920;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x953948;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x953970;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x953998;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  IfcTask::~IfcTask(this_00,&PTR_construction_vtable_24__009539d8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcOrderAction() : Object("IfcOrderAction") {}